

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

void __thiscall absl::lts_20240722::Mutex::Lock(Mutex *this)

{
  ulong uVar1;
  GraphId id;
  SynchLocksHeld *held_locks;
  bool bVar2;
  
  id = DebugOnlyDeadlockCheck(this);
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  if ((uVar1 & 0x19) == 0) {
    LOCK();
    bVar2 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
    if (bVar2) {
      (this->mu_).super___atomic_base<long>._M_i = uVar1 | 8;
    }
    UNLOCK();
    if (bVar2) goto LAB_00109574;
  }
  Lock(this);
LAB_00109574:
  if (_ZN4absl12lts_2024072212_GLOBAL__N_124synch_deadlock_detectionE_0 == 0) {
    return;
  }
  held_locks = Synch_GetAllLocks();
  LockEnter(this,id,held_locks);
  return;
}

Assistant:

void Mutex::Lock() {
  ABSL_TSAN_MUTEX_PRE_LOCK(this, 0);
  GraphId id = DebugOnlyDeadlockCheck(this);
  intptr_t v = mu_.load(std::memory_order_relaxed);
  // try fast acquire, then spin loop
  if (ABSL_PREDICT_FALSE((v & (kMuWriter | kMuReader | kMuEvent)) != 0) ||
      ABSL_PREDICT_FALSE(!mu_.compare_exchange_strong(
          v, kMuWriter | v, std::memory_order_acquire,
          std::memory_order_relaxed))) {
    // try spin acquire, then slow loop
    if (ABSL_PREDICT_FALSE(!TryAcquireWithSpinning(&this->mu_))) {
      this->LockSlow(kExclusive, nullptr, 0);
    }
  }
  DebugOnlyLockEnter(this, id);
  ABSL_TSAN_MUTEX_POST_LOCK(this, 0, 0);
}